

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_NewAwaitObject(ScriptContext *scriptContext)

{
  DynamicObject *pDVar1;
  
  pDVar1 = DynamicObject::New(scriptContext->recycler,
                              (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                              awaitObjectType).ptr);
  return pDVar1;
}

Assistant:

Var JavascriptOperators::OP_NewAwaitObject(ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(NewAwaitObject);
        auto* awaitObject = DynamicObject::New(
            scriptContext->GetRecycler(),
            scriptContext->GetLibrary()->GetAwaitObjectType());
        return awaitObject;
        JIT_HELPER_END(NewAwaitObject);
    }